

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O0

Id dxil_spv::build_allocate_invocation_id_function
             (SPIRVModule *module,uint32_t desc_set,uint32_t binding)

{
  Block *pBVar1;
  Id IVar2;
  Function *pFVar3;
  Instruction *pIVar4;
  Instruction *pIVar5;
  Instruction *atomic_add;
  Instruction *chain;
  Instruction *len_minus_1;
  Instruction *len;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_58;
  Function *local_40;
  Function *func;
  Id bloom_var_id;
  Id uint_type;
  Block *entry;
  Block *current_build_point;
  Builder *builder;
  uint32_t binding_local;
  uint32_t desc_set_local;
  SPIRVModule *module_local;
  
  builder._0_4_ = binding;
  builder._4_4_ = desc_set;
  _binding_local = module;
  current_build_point = (Block *)SPIRVModule::get_builder(module);
  entry = spv::Builder::getBuildPoint((Builder *)current_build_point);
  _bloom_var_id = (Block *)0x0;
  func._4_4_ = spv::Builder::makeUintType((Builder *)current_build_point,0x20);
  func._0_4_ = build_instrumentation_ssbo
                         (_binding_local,func._4_4_,4,"atomics","BloomBufferInvocationSSBO",
                          "BloomBufferInvocation",builder._4_4_,(uint32_t)builder);
  pBVar1 = current_build_point;
  IVar2 = func._4_4_;
  memset(&local_58,0,0x18);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector(&local_58);
  memset(&len,0,0x18);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            *)&len);
  pFVar3 = spv::Builder::makeFunctionEntry
                     ((Builder *)pBVar1,DecorationMax,IVar2,"AllocateInvocationID",&local_58,
                      (Vector<dxil_spv::Vector<Decoration>_> *)&len,(Block **)&bloom_var_id);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             *)&len);
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector(&local_58);
  local_40 = pFVar3;
  pIVar4 = spv::Builder::addInstruction((Builder *)current_build_point,func._4_4_,OpArrayLength);
  spv::Instruction::addIdOperand(pIVar4,(Id)func);
  spv::Instruction::addImmediateOperand(pIVar4,0);
  pIVar5 = spv::Builder::addInstruction((Builder *)current_build_point,func._4_4_,OpISub);
  IVar2 = spv::Instruction::getResultId(pIVar4);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  IVar2 = spv::Builder::makeUintConstant((Builder *)current_build_point,1,false);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  pBVar1 = current_build_point;
  IVar2 = spv::Builder::makePointer
                    ((Builder *)current_build_point,StorageClassStorageBuffer,func._4_4_);
  pIVar4 = spv::Builder::addInstruction((Builder *)pBVar1,IVar2,OpAccessChain);
  spv::Instruction::addIdOperand(pIVar4,(Id)func);
  IVar2 = spv::Builder::makeUintConstant((Builder *)current_build_point,0,false);
  spv::Instruction::addIdOperand(pIVar4,IVar2);
  IVar2 = spv::Instruction::getResultId(pIVar5);
  spv::Instruction::addIdOperand(pIVar4,IVar2);
  pIVar5 = spv::Builder::addInstruction((Builder *)current_build_point,func._4_4_,OpAtomicIAdd);
  IVar2 = spv::Instruction::getResultId(pIVar4);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  IVar2 = spv::Builder::makeUintConstant((Builder *)current_build_point,1,false);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  IVar2 = spv::Builder::makeUintConstant((Builder *)current_build_point,0,false);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  IVar2 = spv::Builder::makeUintConstant((Builder *)current_build_point,0x41c81b37,false);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  pBVar1 = current_build_point;
  IVar2 = spv::Instruction::getResultId(pIVar5);
  spv::Builder::makeReturn((Builder *)pBVar1,false,IVar2);
  spv::Builder::setBuildPoint((Builder *)current_build_point,entry);
  IVar2 = spv::Function::getId(local_40);
  return IVar2;
}

Assistant:

spv::Id build_allocate_invocation_id_function(SPIRVModule &module, uint32_t desc_set, uint32_t binding)
{
	auto &builder = module.get_builder();
	auto *current_build_point = builder.getBuildPoint();
	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);

	spv::Id bloom_var_id = build_instrumentation_ssbo(
		module, uint_type, 4, "atomics", "BloomBufferInvocationSSBO", "BloomBufferInvocation", desc_set, binding);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uint_type, "AllocateInvocationID",
	                                       {}, {}, &entry);

	auto *len = builder.addInstruction(uint_type, spv::OpArrayLength);
	len->addIdOperand(bloom_var_id);
	len->addImmediateOperand(0);

	auto *len_minus_1 = builder.addInstruction(uint_type, spv::OpISub);
	len_minus_1->addIdOperand(len->getResultId());
	len_minus_1->addIdOperand(builder.makeUintConstant(1));

	auto *chain = builder.addInstruction(builder.makePointer(spv::StorageClassStorageBuffer, uint_type), spv::OpAccessChain);
	chain->addIdOperand(bloom_var_id);
	chain->addIdOperand(builder.makeUintConstant(0));
	chain->addIdOperand(len_minus_1->getResultId());

	auto *atomic_add = builder.addInstruction(uint_type, spv::OpAtomicIAdd);
	atomic_add->addIdOperand(chain->getResultId());
	atomic_add->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_add->addIdOperand(builder.makeUintConstant(0));
	atomic_add->addIdOperand(builder.makeUintConstant(1103633207u));

	builder.makeReturn(false, atomic_add->getResultId());
	builder.setBuildPoint(current_build_point);
	return func->getId();
}